

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cc
# Opt level: O3

void default_signal_handler(int signalnr)

{
  Solver *pSVar1;
  int iVar2;
  int __status;
  
  pSVar1 = solver;
  solver[0x670] = (Solver)0x1;
  if (((default_signal_handler(int)::interrupted == '\0') && (signalnr != 0x18)) &&
     (signalnr != 0xb)) {
    default_signal_handler(int)::interrupted = 1;
    return;
  }
  if (0 < *(int *)(pSVar1 + 0x34)) {
    printf("c\nc *** caught signal %d ***\nc\n",signalnr);
    (**(code **)(*(long *)solver + 0x18))();
    puts("c");
    puts("c *** INTERRUPTED ***");
  }
  iVar2 = 0x7c;
  if (signalnr != 0x18) {
    iVar2 = 0;
  }
  __status = 0x8b;
  if (signalnr != 0xb) {
    __status = iVar2;
  }
  _exit(__status);
}

Assistant:

static void default_signal_handler(int signalnr)
{
    static bool interrupted = false;
    solver->interrupt();

    int ret = 0;
    if (signalnr == SIGXCPU) ret = 124;
    if (signalnr == SIGSEGV) ret = 139;
    if (interrupted || ret != 0) {
        if (solver->verbosity > 0) {
            printf("c\nc *** caught signal %d ***\nc\n", signalnr);
            printStats(*solver);
            printf("c\n");
            printf("c *** INTERRUPTED ***\n");
        }
        _exit(ret);
    }

    interrupted = true;
}